

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBcontig8bitCMYKtile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint uVar2;
  byte *pbVar3;
  uint *puVar4;
  uint local_38;
  uint32_t _x;
  uint16_t k;
  uint16_t b;
  uint16_t g;
  uint16_t r;
  int samplesperpixel;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  uVar2 = (uint)img->samplesperpixel;
  _g = h;
  _y_local = cp;
  do {
    local_38 = w;
    if (_g == 0) {
      return;
    }
    for (; 7 < local_38; local_38 = local_38 - 8) {
      uVar1 = 0xff - pp[3];
      *_y_local = (int)((uint)uVar1 * (0xff - (uint)*pp)) / 0xff & 0xffffU |
                  ((int)((uint)uVar1 * (0xff - (uint)pp[1])) / 0xff & 0xffffU) << 8 |
                  (int)((uint)uVar1 * (0xff - (uint)pp[2])) / 0xff << 0x10 | 0xff000000;
      pbVar3 = pp + (int)uVar2;
      uVar1 = 0xff - pbVar3[3];
      _y_local[1] = (int)((uint)uVar1 * (0xff - (uint)*pbVar3)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pbVar3[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pbVar3[2])) / 0xff << 0x10 | 0xff000000;
      pbVar3 = pbVar3 + (int)uVar2;
      uVar1 = 0xff - pbVar3[3];
      _y_local[2] = (int)((uint)uVar1 * (0xff - (uint)*pbVar3)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pbVar3[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pbVar3[2])) / 0xff << 0x10 | 0xff000000;
      pbVar3 = pbVar3 + (int)uVar2;
      uVar1 = 0xff - pbVar3[3];
      _y_local[3] = (int)((uint)uVar1 * (0xff - (uint)*pbVar3)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pbVar3[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pbVar3[2])) / 0xff << 0x10 | 0xff000000;
      pbVar3 = pbVar3 + (int)uVar2;
      uVar1 = 0xff - pbVar3[3];
      _y_local[4] = (int)((uint)uVar1 * (0xff - (uint)*pbVar3)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pbVar3[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pbVar3[2])) / 0xff << 0x10 | 0xff000000;
      pbVar3 = pbVar3 + (int)uVar2;
      uVar1 = 0xff - pbVar3[3];
      _y_local[5] = (int)((uint)uVar1 * (0xff - (uint)*pbVar3)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pbVar3[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pbVar3[2])) / 0xff << 0x10 | 0xff000000;
      pbVar3 = pbVar3 + (int)uVar2;
      uVar1 = 0xff - pbVar3[3];
      puVar4 = _y_local + 7;
      _y_local[6] = (int)((uint)uVar1 * (0xff - (uint)*pbVar3)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pbVar3[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pbVar3[2])) / 0xff << 0x10 | 0xff000000;
      pbVar3 = pbVar3 + (int)uVar2;
      uVar1 = 0xff - pbVar3[3];
      _y_local = _y_local + 8;
      *puVar4 = (int)((uint)uVar1 * (0xff - (uint)*pbVar3)) / 0xff & 0xffffU |
                ((int)((uint)uVar1 * (0xff - (uint)pbVar3[1])) / 0xff & 0xffffU) << 8 |
                (int)((uint)uVar1 * (0xff - (uint)pbVar3[2])) / 0xff << 0x10 | 0xff000000;
      pp = pbVar3 + (int)uVar2;
    }
    if (local_38 != 0) {
      switch(local_38) {
      case 7:
        uVar1 = 0xff - pp[3];
        *_y_local = (int)((uint)uVar1 * (0xff - (uint)*pp)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pp[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pp[2])) / 0xff << 0x10 | 0xff000000;
        pp = pp + (int)uVar2;
        _y_local = _y_local + 1;
      case 6:
        uVar1 = 0xff - pp[3];
        *_y_local = (int)((uint)uVar1 * (0xff - (uint)*pp)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pp[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pp[2])) / 0xff << 0x10 | 0xff000000;
        pp = pp + (int)uVar2;
        _y_local = _y_local + 1;
      case 5:
        uVar1 = 0xff - pp[3];
        *_y_local = (int)((uint)uVar1 * (0xff - (uint)*pp)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pp[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pp[2])) / 0xff << 0x10 | 0xff000000;
        pp = pp + (int)uVar2;
        _y_local = _y_local + 1;
      case 4:
        uVar1 = 0xff - pp[3];
        *_y_local = (int)((uint)uVar1 * (0xff - (uint)*pp)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pp[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pp[2])) / 0xff << 0x10 | 0xff000000;
        pp = pp + (int)uVar2;
        _y_local = _y_local + 1;
      case 3:
        uVar1 = 0xff - pp[3];
        *_y_local = (int)((uint)uVar1 * (0xff - (uint)*pp)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pp[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pp[2])) / 0xff << 0x10 | 0xff000000;
        pp = pp + (int)uVar2;
        _y_local = _y_local + 1;
      case 2:
        uVar1 = 0xff - pp[3];
        *_y_local = (int)((uint)uVar1 * (0xff - (uint)*pp)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pp[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pp[2])) / 0xff << 0x10 | 0xff000000;
        pp = pp + (int)uVar2;
        _y_local = _y_local + 1;
      case 1:
        uVar1 = 0xff - pp[3];
        *_y_local = (int)((uint)uVar1 * (0xff - (uint)*pp)) / 0xff & 0xffffU |
                    ((int)((uint)uVar1 * (0xff - (uint)pp[1])) / 0xff & 0xffffU) << 8 |
                    (int)((uint)uVar1 * (0xff - (uint)pp[2])) / 0xff << 0x10 | 0xff000000;
        pp = pp + (int)uVar2;
        _y_local = _y_local + 1;
      }
    }
    _y_local = _y_local + toskew;
    pp = pp + (int)(uVar2 * fromskew);
    _g = _g - 1;
  } while( true );
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bitCMYKtile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t r, g, b, k;

    (void)x;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, k = 255 - pp[3]; r = (k * (255 - pp[0])) / 255;
                g = (k * (255 - pp[1])) / 255; b = (k * (255 - pp[2])) / 255;
                *cp++ = PACK(r, g, b); pp += samplesperpixel);
        cp += toskew;
        pp += fromskew;
    }
}